

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O0

void __thiscall FIX::Session::generateRetransmits(Session *this,SEQNUM beginSeqNo,SEQNUM endSeqNo)

{
  field_metrics *this_00;
  message_order *pmVar1;
  message_order *pmVar2;
  message_order *headerOrder_00;
  pointer pbVar3;
  bool bVar4;
  BeginString *beginString;
  DataDictionary *this_01;
  ulong uVar5;
  Message *pMVar6;
  Message *this_02;
  reference pbVar7;
  FieldMap *pFVar8;
  string *psVar9;
  IntTConvertor<unsigned_long> *this_03;
  uint64_t uVar10;
  pointer pbVar11;
  size_t __n;
  void *__buf;
  unsigned_long value;
  int __flags;
  UInt64Field local_4e8;
  pointer local_490;
  SEQNUM next;
  string local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  type local_3f0;
  Message *msg;
  message_order *messageOrder_1;
  message_order *trailerOrder_1;
  message_order *headerOrder_1;
  message_order *messageOrder;
  message_order *trailerOrder;
  message_order *headerOrder;
  DataDictionary *applicationDD;
  undefined1 local_358 [8];
  ApplVerID applVerID;
  Message msg_1;
  size_type soh;
  size_type equalSign;
  DataDictionary *sessionDD;
  string strMsgType;
  unique_ptr<FIX::Message,_std::default_delete<FIX::Message>_> pMsg;
  undefined1 local_138 [8];
  string messageString;
  SEQNUM SStack_110;
  bool appMessageJustSent;
  SEQNUM current;
  SEQNUM begin;
  MsgType msgType;
  MsgSeqNum msgSeqNum;
  iterator i;
  undefined1 local_38 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  messages;
  SEQNUM endSeqNo_local;
  SEQNUM beginSeqNo_local;
  Session *this_local;
  
  messages.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)endSeqNo;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_38);
  SessionState::get(&this->m_state,beginSeqNo,
                    (SEQNUM)messages.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                    (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_38);
  __gnu_cxx::
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::__normal_iterator((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)&msgSeqNum.super_SeqNumField.super_FieldBase.m_metrics);
  MsgSeqNum::MsgSeqNum((MsgSeqNum *)&msgType.super_StringField.super_FieldBase.m_metrics,0);
  MsgType::MsgType((MsgType *)&begin);
  current = 0;
  messageString.field_2._M_local_buf[0xf] = '\0';
  std::__cxx11::string::string((string *)local_138);
  msgSeqNum.super_SeqNumField.super_FieldBase.m_metrics =
       (field_metrics)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_38);
  SStack_110 = beginSeqNo;
  while( true ) {
    pMsg._M_t.super___uniq_ptr_impl<FIX::Message,_std::default_delete<FIX::Message>_>._M_t.
    super__Tuple_impl<0UL,_FIX::Message_*,_std::default_delete<FIX::Message>_>.
    super__Head_base<0UL,_FIX::Message_*,_false>._M_head_impl =
         (__uniq_ptr_data<FIX::Message,_std::default_delete<FIX::Message>,_true,_true>)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_38);
    bVar4 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&msgSeqNum.super_SeqNumField.super_FieldBase.m_metrics,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&pMsg);
    if (!bVar4) break;
    messageString.field_2._M_local_buf[0xf] = '\0';
    std::unique_ptr<FIX::Message,std::default_delete<FIX::Message>>::
    unique_ptr<std::default_delete<FIX::Message>,void>
              ((unique_ptr<FIX::Message,std::default_delete<FIX::Message>> *)
               (strMsgType.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)&sessionDD);
    beginString = SessionID::getBeginString(&this->m_sessionID);
    this_01 = DataDictionaryProvider::getSessionDataDictionary
                        (&this->m_dataDictionaryProvider,beginString);
    bVar4 = DataDictionary::isMessageFieldsOrderPreserved(this_01);
    if (bVar4) {
      this_00 = &msgSeqNum.super_SeqNumField.super_FieldBase.m_metrics;
      pbVar7 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)this_00);
      std::__cxx11::string::find((char *)pbVar7,0x2e25e2);
      pbVar7 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)this_00);
      std::__cxx11::string::find_first_of((char)pbVar7,1);
      pbVar7 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)this_00);
      std::__cxx11::string::substr((ulong)&msg_1.m_validStructure,(ulong)pbVar7);
      std::__cxx11::string::operator=((string *)&sessionDD,(string *)&msg_1.m_validStructure);
      std::__cxx11::string::~string((string *)&msg_1.m_validStructure);
    }
    bVar4 = SessionID::isFIXT(&this->m_sessionID);
    if (bVar4) {
      Message::Message((Message *)&applVerID.super_StringField.super_FieldBase.m_metrics);
      pbVar7 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&msgSeqNum.super_SeqNumField.super_FieldBase.m_metrics);
      Message::setStringHeader
                ((Message *)&applVerID.super_StringField.super_FieldBase.m_metrics,pbVar7);
      ApplVerID::ApplVerID((ApplVerID *)local_358);
      pFVar8 = &Message::getHeader((Message *)&applVerID.super_StringField.super_FieldBase.m_metrics
                                  )->super_FieldMap;
      bVar4 = FieldMap::getFieldIfSet(pFVar8,(FieldBase *)local_358);
      if (!bVar4) {
        ApplVerID::ApplVerID((ApplVerID *)&applicationDD,&this->m_senderDefaultApplVerID);
        ApplVerID::operator=((ApplVerID *)local_358,(ApplVerID *)&applicationDD);
        ApplVerID::~ApplVerID((ApplVerID *)&applicationDD);
      }
      headerOrder = (message_order *)
                    DataDictionaryProvider::getApplicationDataDictionary
                              (&this->m_dataDictionaryProvider,(ApplVerID *)local_358);
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        trailerOrder = DataDictionary::getHeaderOrderedFields(this_01);
        messageOrder = DataDictionary::getTrailerOrderedFields(this_01);
        headerOrder_1 =
             DataDictionary::getMessageOrderedFields
                       ((DataDictionary *)headerOrder,(string *)&sessionDD);
        pMVar6 = (Message *)operator_new(0x158);
        headerOrder_00 = trailerOrder;
        pmVar2 = messageOrder;
        pmVar1 = headerOrder_1;
        pbVar7 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&msgSeqNum.super_SeqNumField.super_FieldBase.m_metrics);
        Message::Message(pMVar6,headerOrder_00,pmVar2,pmVar1,pbVar7,this_01,
                         (DataDictionary *)headerOrder,(bool)(this->m_validateLengthAndChecksum & 1)
                        );
        std::unique_ptr<FIX::Message,_std::default_delete<FIX::Message>_>::reset
                  ((unique_ptr<FIX::Message,_std::default_delete<FIX::Message>_> *)
                   ((long)&strMsgType.field_2 + 8),pMVar6);
      }
      else {
        pMVar6 = (Message *)operator_new(0x158);
        pbVar7 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&msgSeqNum.super_SeqNumField.super_FieldBase.m_metrics);
        Message::Message(pMVar6,pbVar7,this_01,(DataDictionary *)headerOrder,
                         (bool)(this->m_validateLengthAndChecksum & 1));
        std::unique_ptr<FIX::Message,_std::default_delete<FIX::Message>_>::reset
                  ((unique_ptr<FIX::Message,_std::default_delete<FIX::Message>_> *)
                   ((long)&strMsgType.field_2 + 8),pMVar6);
      }
      ApplVerID::~ApplVerID((ApplVerID *)local_358);
      Message::~Message((Message *)&applVerID.super_StringField.super_FieldBase.m_metrics);
    }
    else {
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        trailerOrder_1 = DataDictionary::getHeaderOrderedFields(this_01);
        messageOrder_1 = DataDictionary::getTrailerOrderedFields(this_01);
        msg = (Message *)DataDictionary::getMessageOrderedFields(this_01,(string *)&sessionDD);
        this_02 = (Message *)operator_new(0x158);
        pmVar2 = trailerOrder_1;
        pmVar1 = messageOrder_1;
        pMVar6 = msg;
        pbVar7 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&msgSeqNum.super_SeqNumField.super_FieldBase.m_metrics);
        Message::Message(this_02,pmVar2,pmVar1,(message_order *)pMVar6,pbVar7,this_01,
                         (bool)(this->m_validateLengthAndChecksum & 1));
        std::unique_ptr<FIX::Message,_std::default_delete<FIX::Message>_>::reset
                  ((unique_ptr<FIX::Message,_std::default_delete<FIX::Message>_> *)
                   ((long)&strMsgType.field_2 + 8),this_02);
      }
      else {
        pMVar6 = (Message *)operator_new(0x158);
        pbVar7 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&msgSeqNum.super_SeqNumField.super_FieldBase.m_metrics);
        Message::Message(pMVar6,pbVar7,this_01,(bool)(this->m_validateLengthAndChecksum & 1));
        std::unique_ptr<FIX::Message,_std::default_delete<FIX::Message>_>::reset
                  ((unique_ptr<FIX::Message,_std::default_delete<FIX::Message>_> *)
                   ((long)&strMsgType.field_2 + 8),pMVar6);
      }
    }
    local_3f0 = std::unique_ptr<FIX::Message,_std::default_delete<FIX::Message>_>::operator*
                          ((unique_ptr<FIX::Message,_std::default_delete<FIX::Message>_> *)
                           ((long)&strMsgType.field_2 + 8));
    pFVar8 = &Message::getHeader(local_3f0)->super_FieldMap;
    FieldMap::getField(pFVar8,(FieldBase *)&msgType.super_StringField.super_FieldBase.m_metrics);
    pFVar8 = &Message::getHeader(local_3f0)->super_FieldMap;
    FieldMap::getField(pFVar8,(FieldBase *)&begin);
    uVar10 = UInt64Field::operator_cast_to_unsigned_long
                       ((UInt64Field *)&msgType.super_StringField.super_FieldBase.m_metrics);
    if ((SStack_110 != uVar10) && (current == 0)) {
      current = SStack_110;
    }
    bVar4 = Message::isAdminMsgType((MsgType *)&begin);
    if (bVar4) {
      if (current == 0) {
        current = UInt64Field::operator_cast_to_unsigned_long
                            ((UInt64Field *)&msgType.super_StringField.super_FieldBase.m_metrics);
      }
    }
    else {
      bVar4 = resend(this,local_3f0);
      if (bVar4) {
        if (current != 0) {
          uVar10 = UInt64Field::operator_cast_to_unsigned_long
                             ((UInt64Field *)&msgType.super_StringField.super_FieldBase.m_metrics);
          generateSequenceReset(this,current,uVar10);
        }
        __n = 9;
        __flags = 10;
        psVar9 = Message::toString(local_3f0,(string *)local_138,8,9,10);
        send(this,(int)psVar9,__buf,__n,__flags);
        this_03 = (IntTConvertor<unsigned_long> *)
                  UInt64Field::operator_cast_to_unsigned_long
                            ((UInt64Field *)&msgType.super_StringField.super_FieldBase.m_metrics);
        IntTConvertor<unsigned_long>::convert_abi_cxx11_(&local_430,this_03,value);
        std::operator+(&local_410,"Resending Message: ",&local_430);
        SessionState::onEvent(&this->m_state,&local_410);
        std::__cxx11::string::~string((string *)&local_410);
        std::__cxx11::string::~string((string *)&local_430);
        current = 0;
        messageString.field_2._M_local_buf[0xf] = '\x01';
      }
      else if (current == 0) {
        current = UInt64Field::operator_cast_to_unsigned_long
                            ((UInt64Field *)&msgType.super_StringField.super_FieldBase.m_metrics);
      }
    }
    uVar10 = UInt64Field::operator_cast_to_unsigned_long
                       ((UInt64Field *)&msgType.super_StringField.super_FieldBase.m_metrics);
    SStack_110 = uVar10 + 1;
    std::__cxx11::string::~string((string *)&sessionDD);
    std::unique_ptr<FIX::Message,_std::default_delete<FIX::Message>_>::~unique_ptr
              ((unique_ptr<FIX::Message,_std::default_delete<FIX::Message>_> *)
               ((long)&strMsgType.field_2 + 8));
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&msgSeqNum.super_SeqNumField.super_FieldBase.m_metrics);
  }
  if (current != 0) {
    uVar10 = UInt64Field::operator_cast_to_unsigned_long
                       ((UInt64Field *)&msgType.super_StringField.super_FieldBase.m_metrics);
    generateSequenceReset(this,current,uVar10 + 1);
  }
  pbVar3 = messages.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pbVar11 = (pointer)UInt64Field::operator_cast_to_unsigned_long
                               ((UInt64Field *)&msgType.super_StringField.super_FieldBase.m_metrics)
  ;
  if (pbVar11 < pbVar3) {
    EndSeqNo::EndSeqNo((EndSeqNo *)&next,
                       (SEQNUM)&(messages.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)->field_0x1);
    messages.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)UInt64Field::operator_cast_to_unsigned_long((UInt64Field *)&next);
    EndSeqNo::~EndSeqNo((EndSeqNo *)&next);
    local_490 = (pointer)SessionState::getNextSenderMsgSeqNum(&this->m_state);
    if (local_490 <
        messages.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      EndSeqNo::EndSeqNo((EndSeqNo *)&local_4e8,(SEQNUM)local_490);
      messages.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)UInt64Field::operator_cast_to_unsigned_long(&local_4e8);
      EndSeqNo::~EndSeqNo((EndSeqNo *)&local_4e8);
    }
    endSeqNo_local = beginSeqNo;
    if ((messageString.field_2._M_local_buf[0xf] & 1U) != 0) {
      uVar10 = UInt64Field::operator_cast_to_unsigned_long
                         ((UInt64Field *)&msgType.super_StringField.super_FieldBase.m_metrics);
      endSeqNo_local = uVar10 + 1;
    }
    generateSequenceReset
              (this,endSeqNo_local,
               (SEQNUM)messages.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  std::__cxx11::string::~string((string *)local_138);
  MsgType::~MsgType((MsgType *)&begin);
  MsgSeqNum::~MsgSeqNum((MsgSeqNum *)&msgType.super_StringField.super_FieldBase.m_metrics);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_38);
  return;
}

Assistant:

void Session::generateRetransmits(SEQNUM beginSeqNo, SEQNUM endSeqNo) {
  std::vector<std::string> messages;
  m_state.get(beginSeqNo, endSeqNo, messages);

  std::vector<std::string>::iterator i;
  MsgSeqNum msgSeqNum(0);
  MsgType msgType;
  SEQNUM begin = 0;
  SEQNUM current = beginSeqNo;
  bool appMessageJustSent = false;
  std::string messageString;

  for (i = messages.begin(); i != messages.end(); ++i) {
    appMessageJustSent = false;
    std::unique_ptr<FIX::Message> pMsg;
    std::string strMsgType;
    const DataDictionary &sessionDD = m_dataDictionaryProvider.getSessionDataDictionary(m_sessionID.getBeginString());
    if (sessionDD.isMessageFieldsOrderPreserved()) {
      std::string::size_type equalSign = (*i).find("\00135=");
      equalSign += 4;
      std::string::size_type soh = (*i).find_first_of('\001', equalSign);
      strMsgType = (*i).substr(equalSign, soh - equalSign);
    }

    if (m_sessionID.isFIXT()) {
      Message msg;
      msg.setStringHeader(*i);
      ApplVerID applVerID;
      if (!msg.getHeader().getFieldIfSet(applVerID)) {
        applVerID = m_senderDefaultApplVerID;
      }

      const DataDictionary &applicationDD = m_dataDictionaryProvider.getApplicationDataDictionary(applVerID);
      if (strMsgType.empty()) {
        pMsg.reset(new Message(*i, sessionDD, applicationDD, m_validateLengthAndChecksum));
      } else {
        const message_order &headerOrder = sessionDD.getHeaderOrderedFields();
        const message_order &trailerOrder = sessionDD.getTrailerOrderedFields();
        const message_order &messageOrder = applicationDD.getMessageOrderedFields(strMsgType);
        pMsg.reset(new Message(
            headerOrder,
            trailerOrder,
            messageOrder,
            *i,
            sessionDD,
            applicationDD,
            m_validateLengthAndChecksum));
      }
    } else {
      if (strMsgType.empty()) {
        pMsg.reset(new Message(*i, sessionDD, m_validateLengthAndChecksum));
      } else {
        const message_order &headerOrder = sessionDD.getHeaderOrderedFields();
        const message_order &trailerOrder = sessionDD.getTrailerOrderedFields();
        const message_order &messageOrder = sessionDD.getMessageOrderedFields(strMsgType);
        pMsg.reset(new Message(headerOrder, trailerOrder, messageOrder, *i, sessionDD, m_validateLengthAndChecksum));
      }
    }

    Message &msg = *pMsg;

    msg.getHeader().getField(msgSeqNum);
    msg.getHeader().getField(msgType);

    if ((current != msgSeqNum) && !begin) {
      begin = current;
    }

    if (Message::isAdminMsgType(msgType)) {
      if (!begin) {
        begin = msgSeqNum;
      }
    } else {
      if (resend(msg)) {
        if (begin) {
          generateSequenceReset(begin, msgSeqNum);
        }
        send(msg.toString(messageString));
        m_state.onEvent("Resending Message: " + SEQNUM_CONVERTOR::convert(msgSeqNum));
        begin = 0;
        appMessageJustSent = true;
      } else {
        if (!begin) {
          begin = msgSeqNum;
        }
      }
    }
    current = msgSeqNum + 1;
  }
  if (begin) {
    generateSequenceReset(begin, msgSeqNum + 1);
  }

  if (endSeqNo > msgSeqNum) {
    endSeqNo = EndSeqNo(endSeqNo + 1);
    auto next = m_state.getNextSenderMsgSeqNum();
    if (endSeqNo > next) {
      endSeqNo = EndSeqNo(next);
    }
    if (appMessageJustSent) {
      beginSeqNo = msgSeqNum + 1;
    }
    generateSequenceReset(beginSeqNo, endSeqNo);
  }
}